

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

void __thiscall cmQtAutoGenerator::Logger::Logger(Logger *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  string verbose;
  unsigned_long iVerbose;
  string local_38;
  unsigned_long local_18;
  
  *(undefined8 *)((long)&(this->Mutex_).super___mutex_base._M_mutex.__data.__list.__prev + 5) = 0;
  *(undefined8 *)((long)&(this->Mutex_).super___mutex_base._M_mutex.__data.__list.__next + 5) = 0;
  *(undefined8 *)((long)&(this->Mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->Mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->Mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->Mutex_).super___mutex_base._M_mutex + 8) = 0;
  paVar1 = &local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmsys::SystemTools::GetEnv("VERBOSE",&local_38);
  if (bVar2 && local_38._M_string_length != 0) {
    local_18 = 0;
    bVar2 = cmSystemTools::StringToULong(local_38._M_dataplus._M_p,&local_18);
    if (bVar2) {
      uVar3 = (uint)local_18;
    }
    else {
      bVar2 = cmSystemTools::IsOn(&local_38);
      uVar3 = (uint)bVar2;
    }
    this->Verbosity_ = uVar3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)paVar1;
  cmsys::SystemTools::GetEnv("COLOR",&local_38);
  if (local_38._M_string_length == 0) {
    bVar2 = true;
  }
  else {
    bVar2 = cmSystemTools::IsOn(&local_38);
  }
  this->ColorOutput_ = bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

cmQtAutoGenerator::Logger::Logger()
{
  // Initialize logger
  {
    std::string verbose;
    if (cmSystemTools::GetEnv("VERBOSE", verbose) && !verbose.empty()) {
      unsigned long iVerbose = 0;
      if (cmSystemTools::StringToULong(verbose.c_str(), &iVerbose)) {
        SetVerbosity(static_cast<unsigned int>(iVerbose));
      } else {
        // Non numeric verbosity
        SetVerbose(cmSystemTools::IsOn(verbose));
      }
    }
  }
  {
    std::string colorEnv;
    cmSystemTools::GetEnv("COLOR", colorEnv);
    if (!colorEnv.empty()) {
      SetColorOutput(cmSystemTools::IsOn(colorEnv));
    } else {
      SetColorOutput(true);
    }
  }
}